

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O1

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::set(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      *this,ConfigData *obj,string *stringValue)

{
  undefined1 local_40 [8];
  type value;
  
  value._M_dataplus._M_p = (pointer)0x0;
  value._M_string_length._0_1_ = 0;
  local_40 = (undefined1  [8])&value._M_string_length;
  std::__cxx11::string::_M_assign((string *)local_40);
  (*this->function)(obj,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
  if (local_40 != (undefined1  [8])&value._M_string_length) {
    operator_delete((void *)local_40,
                    CONCAT71(value._M_string_length._1_7_,(undefined1)value._M_string_length) + 1);
  }
  return;
}

Assistant:

virtual void set( C& obj, std::string const& stringValue ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( stringValue, value );
                function( obj, value );
            }